

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_type.cc
# Opt level: O0

void asn1_type_set0_string(ASN1_TYPE *a,ASN1_STRING *str)

{
  bool bVar1;
  int local_1c;
  int type;
  ASN1_STRING *str_local;
  ASN1_TYPE *a_local;
  
  local_1c = str->type;
  if (local_1c == 0x102) {
    local_1c = 2;
  }
  else if (local_1c == 0x10a) {
    local_1c = 10;
  }
  bVar1 = false;
  if ((local_1c != 5) && (bVar1 = false, local_1c != 6)) {
    bVar1 = local_1c != 1;
  }
  if (bVar1) {
    ASN1_TYPE_set((ASN1_TYPE *)a,local_1c,str);
    return;
  }
  __assert_fail("type != V_ASN1_NULL && type != V_ASN1_OBJECT && type != V_ASN1_BOOLEAN",
                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/a_type.cc"
                ,0x40,"void asn1_type_set0_string(ASN1_TYPE *, ASN1_STRING *)");
}

Assistant:

void asn1_type_set0_string(ASN1_TYPE *a, ASN1_STRING *str) {
  // |ASN1_STRING| types are almost the same as |ASN1_TYPE| types, except that
  // the negative flag is not reflected into |ASN1_TYPE|.
  int type = str->type;
  if (type == V_ASN1_NEG_INTEGER) {
    type = V_ASN1_INTEGER;
  } else if (type == V_ASN1_NEG_ENUMERATED) {
    type = V_ASN1_ENUMERATED;
  }

  // These types are not |ASN1_STRING| types and use a different
  // representation when stored in |ASN1_TYPE|.
  assert(type != V_ASN1_NULL && type != V_ASN1_OBJECT &&
         type != V_ASN1_BOOLEAN);
  ASN1_TYPE_set(a, type, str);
}